

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

int push_captures(MatchState *ms,char *s,char *e)

{
  int space;
  int iVar1;
  
  iVar1 = ms->level;
  space = 1;
  if (iVar1 != 0) {
    space = iVar1;
  }
  if (s == (char *)0x0) {
    space = iVar1;
  }
  luaL_checkstack(ms->L,space,"too many captures");
  if (0 < space) {
    iVar1 = 0;
    do {
      push_onecapture(ms,iVar1,s,e);
      iVar1 = iVar1 + 1;
    } while (space != iVar1);
  }
  return space;
}

Assistant:

static int push_captures (MatchState *ms, const char *s, const char *e) {
  int i;
  int nlevels = (ms->level == 0 && s) ? 1 : ms->level;
  luaL_checkstack(ms->L, nlevels, "too many captures");
  for (i = 0; i < nlevels; i++)
    push_onecapture(ms, i, s, e);
  return nlevels;  /* number of strings pushed */
}